

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box_Hierarchy.cpp
# Opt level: O0

void __thiscall
Nova::Box_Hierarchy<float,_3>::Intersection_List
          (Box_Hierarchy<float,_3> *this,TV *X,Array<int> *intersection_list)

{
  Box_Hierarchy<float,_3> *pBVar1;
  pointer this_00;
  bool bVar2;
  Box_Hierarchy<float,_3> **ppBVar3;
  size_t sVar4;
  int *x;
  ulong local_68;
  size_t i_1;
  size_t i;
  Box_Hierarchy<float,_3> *node;
  Box_Hierarchy<float,_3> *local_40;
  undefined1 local_38 [8];
  Array<const_Nova::Box_Hierarchy<float,_3>_*> stack;
  Array<int> *intersection_list_local;
  TV *X_local;
  Box_Hierarchy<float,_3> *this_local;
  
  stack._data.
  super__Vector_base<const_Nova::Box_Hierarchy<float,_3>_*,_std::allocator<const_Nova::Box_Hierarchy<float,_3>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)intersection_list;
  Array<const_Nova::Box_Hierarchy<float,_3>_*>::Array
            ((Array<const_Nova::Box_Hierarchy<float,_3>_*> *)local_38);
  local_40 = this;
  Array<const_Nova::Box_Hierarchy<float,_3>_*>::Append
            ((Array<const_Nova::Box_Hierarchy<float,_3>_*> *)local_38,&local_40);
  while (bVar2 = Array<const_Nova::Box_Hierarchy<float,_3>_*>::Empty
                           ((Array<const_Nova::Box_Hierarchy<float,_3>_*> *)local_38),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    ppBVar3 = Array<const_Nova::Box_Hierarchy<float,_3>_*>::Back
                        ((Array<const_Nova::Box_Hierarchy<float,_3>_*> *)local_38);
    pBVar1 = *ppBVar3;
    Array<const_Nova::Box_Hierarchy<float,_3>_*>::Pop_Back
              ((Array<const_Nova::Box_Hierarchy<float,_3>_*> *)local_38);
    bVar2 = Range<float,_3>::Inside(&(pBVar1->box).super_Range<float,_3>,X);
    if (bVar2) {
      for (i_1 = 0; sVar4 = Array<int>::size(&pBVar1->index),
          this_00 = stack._data.
                    super__Vector_base<const_Nova::Box_Hierarchy<float,_3>_*,_std::allocator<const_Nova::Box_Hierarchy<float,_3>_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage, i_1 < sVar4; i_1 = i_1 + 1)
      {
        x = Array<int>::operator[](&pBVar1->index,(int)i_1);
        Array<int>::Append((Array<int> *)this_00,x);
      }
      for (local_68 = 0; sVar4 = Array<Nova::Box_Hierarchy<float,_3>_*>::size(&pBVar1->children),
          local_68 < sVar4; local_68 = local_68 + 1) {
        ppBVar3 = Array<Nova::Box_Hierarchy<float,_3>_*>::operator[]
                            (&pBVar1->children,(int)local_68);
        Array<const_Nova::Box_Hierarchy<float,_3>_*>::Append
                  ((Array<const_Nova::Box_Hierarchy<float,_3>_*> *)local_38,ppBVar3);
      }
    }
  }
  Array<const_Nova::Box_Hierarchy<float,_3>_*>::~Array
            ((Array<const_Nova::Box_Hierarchy<float,_3>_*> *)local_38);
  return;
}

Assistant:

void Box_Hierarchy<T,d>::
Intersection_List(const TV& X,Array<int>& intersection_list)
{
    Array<const Box_Hierarchy<T,d>*> stack;
    stack.Append(this);
    while(!stack.Empty()){const Box_Hierarchy<T,d>* node=stack.Back();
        stack.Pop_Back();
        // check if node is a leaf and if there is an intersection
        if(node->box.Inside(X)){
            for(size_t i=0;i<node->index.size();++i) intersection_list.Append(node->index[i]);

            // push children of the node on the stack
            for(size_t i=0;i<node->children.size();++i) stack.Append(node->children[i]);}}
}